

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O2

QIcon __thiscall
QCommonStylePrivate::iconFromResourceTheme
          (QCommonStylePrivate *this,StandardPixmap standardIcon,QStyleOption *option,
          QWidget *widget)

{
  QIcon QVar1;
  bool bVar2;
  QStyle *pQVar3;
  byte bVar4;
  undefined1 *puVar5;
  char16_t *pcVar6;
  size_type sVar7;
  Mode mode;
  long lVar8;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QStringView prefix;
  QStringView prefix_00;
  QStringView prefix_01;
  QStringView prefix_02;
  initializer_list<int> sizes;
  initializer_list<int> sizes_00;
  initializer_list<int> sizes_01;
  initializer_list<int> sizes_02;
  size_type sStackY_70;
  State state;
  undefined8 local_58;
  QIcon icon;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&icon);
  if (0x4e < (uint)option) goto switchD_003291f7_caseD_18;
  pQVar3 = (QStyle *)
           ((long)&switchD_003291f7::switchdataD_005ec508 +
           (long)(int)(&switchD_003291f7::switchdataD_005ec508)[(ulong)option & 0xffffffff]);
  switch((ulong)option & 0xffffffff) {
  case 0:
    titleBarMenuCachedPixmapFromXPM();
    QIcon::addPixmap((QPixmap *)&icon,(Mode)&local_48,On);
    QPixmap::~QPixmap((QPixmap *)&local_48);
    latin1.m_data = ":/qt-project.org/qmessagebox/images/qtlogo-64.png";
    latin1.m_size = 0x31;
    QString::QString((QString *)&local_48,latin1);
    local_58 = 0xffffffffffffffff;
    QIcon::addFile((QString *)&icon,(QSize *)&local_48,(Mode)&local_58,On);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    goto switchD_003291f7_caseD_18;
  case 1:
    pcVar6 = L"titlebar-min-";
    goto LAB_003296a4;
  case 2:
    pcVar6 = L"titlebar-max-";
LAB_003296a4:
    puVar5 = _ZGRL13titleBarSizes_;
    goto LAB_0032980b;
  case 3:
  case 8:
    pcVar6 = L"fusion_closedock-";
    sStackY_70 = 10;
    goto LAB_0032968e;
  case 4:
    pcVar6 = L"fusion_normalizedockup-";
    sStackY_70 = 0x10;
LAB_0032968e:
    sVar7 = sStackY_70;
    pcVar6 = pcVar6 + 7;
    puVar5 = _ZGRL18dockTitleIconSizes_;
    sStackY_70 = 6;
    goto LAB_00329963;
  case 5:
    pcVar6 = L"titlebar-shade-";
    puVar5 = _ZGRL13titleBarSizes_;
    goto LAB_00329625;
  case 6:
    pcVar6 = L"titlebar-unshade-";
    puVar5 = _ZGRL13titleBarSizes_;
    goto LAB_003294de;
  case 7:
    pcVar6 = L"titlebar-contexthelp-";
    puVar5 = _ZGRL13titleBarSizes_;
    goto LAB_003297d3;
  case 9:
    pcVar6 = L"information-";
    goto LAB_00329957;
  case 10:
    pcVar6 = L"warning-";
    goto LAB_003297b0;
  case 0xb:
    pcVar6 = L"critical-";
    goto LAB_003297e8;
  case 0xc:
    pcVar6 = L"question-";
    goto LAB_003297e8;
  case 0xd:
    local_48.d = (Data *)0x2000000010;
    pcVar6 = L"desktop-";
    goto LAB_003298a8;
  case 0xe:
    pcVar6 = L"trash-";
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 6;
    break;
  case 0xf:
    local_48.d = (Data *)0x2000000010;
    pcVar6 = L"computer-";
    sStackY_70 = 9;
    goto LAB_003298aa;
  case 0x10:
    pcVar6 = L"floppy-";
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 7;
    break;
  case 0x11:
    pcVar6 = L"harddrive-";
    goto LAB_0032993e;
  case 0x12:
    pcVar6 = L"cdr-";
    goto LAB_003296e4;
  case 0x13:
    pcVar6 = L"dvd-";
LAB_003296e4:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 4;
    break;
  case 0x14:
    pcVar6 = L"networkdrive-";
    goto LAB_00329804;
  case 0x15:
    pcVar6 = L"diropen-";
    goto LAB_003297b0;
  case 0x16:
    pcVar6 = L"dirclosed-";
    goto LAB_0032993e;
  case 0x17:
    pcVar6 = L"dirlink-";
LAB_003297b0:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 8;
    break;
  default:
    goto switchD_003291f7_caseD_18;
  case 0x19:
    pcVar6 = L"file-";
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 5;
    break;
  case 0x1a:
    pcVar6 = L"filelink-";
    goto LAB_003297e8;
  case 0x1b:
    bVar2 = rtl((QStyleOption *)widget);
    pcVar6 = L"toolbar-ext-h-";
    if (bVar2) {
      pcVar6 = L"toolbar-ext-h-rtl-";
    }
    sVar7 = (ulong)bVar2 * 4 + 0xe;
    puVar5 = _ZGRL16toolBarExtHSizes_;
    goto LAB_003293b4;
  case 0x1c:
    pcVar6 = L"toolbar-ext-v-";
    puVar5 = _ZGRL16toolBarExtVSizes_;
    sVar7 = 0xe;
LAB_003293b4:
    sStackY_70 = 4;
    goto LAB_00329963;
  case 0x1d:
    pcVar6 = L"filedialog_start-";
    puVar5 = _ZGRL12pngIconSizes_;
LAB_003294de:
    sStackY_70 = 0x11;
    break;
  case 0x1e:
    pcVar6 = L"filedialog_end-";
    puVar5 = _ZGRL12pngIconSizes_;
LAB_00329625:
    sStackY_70 = 0xf;
    break;
  case 0x1f:
    pQVar3 = QStyle::proxy(pQVar3);
    lVar8 = *(long *)pQVar3;
    sStackY_70 = 0x32;
    goto LAB_00329789;
  case 0x20:
    pcVar6 = L"newdirectory-";
    goto LAB_00329804;
  case 0x21:
    pcVar6 = L"viewdetailed-";
    goto LAB_00329804;
  case 0x22:
    pcVar6 = L"fileinfo-";
    goto LAB_003297e8;
  case 0x23:
    pcVar6 = L"filecontents-";
LAB_00329804:
    puVar5 = _ZGRL12pngIconSizes_;
LAB_0032980b:
    sStackY_70 = 0xd;
    break;
  case 0x24:
    pcVar6 = L"viewlist-";
    goto LAB_003297e8;
  case 0x25:
    pQVar3 = QStyle::proxy(pQVar3);
    lVar8 = *(long *)pQVar3;
    sStackY_70 = 0x36;
LAB_00329789:
    (**(code **)(lVar8 + 0x100))(this,pQVar3,sStackY_70,widget);
    goto LAB_0032997f;
  case 0x26:
  case 0x38:
    sStackY_70 = 3;
    prefix.m_data = L"dirclosed-";
    prefix.m_size = 10;
    sizes._M_len = 3;
    sizes._M_array = (iterator)_ZGRL12pngIconSizes_;
    addIconFiles<int>(prefix,sizes,&icon,Normal,Off);
    state = On;
    pcVar6 = L"diropen-";
    sVar7 = 8;
    puVar5 = _ZGRL12pngIconSizes_;
    goto LAB_00329969;
  case 0x27:
    pcVar6 = L"standardbutton-ok-";
    goto LAB_00329345;
  case 0x28:
    pcVar6 = L"standardbutton-cancel-";
    goto LAB_003298ec;
  case 0x29:
    pcVar6 = L"standardbutton-help-";
    goto LAB_003298d0;
  case 0x2a:
    pcVar6 = L"standardbutton-open-";
    goto LAB_003298d0;
  case 0x2b:
    pcVar6 = L"standardbutton-save-";
    goto LAB_003298d0;
  case 0x2c:
    pcVar6 = L"standardbutton-close-";
    goto LAB_00329757;
  case 0x2d:
    pcVar6 = L"standardbutton-apply-";
    goto LAB_00329757;
  case 0x2e:
    pcVar6 = L"standardbutton-clear-";
LAB_00329757:
    puVar5 = _ZGRL12pngIconSizes_;
LAB_003297d3:
    sStackY_70 = 0x15;
    break;
  case 0x2f:
    pcVar6 = L"standardbutton-delete-";
LAB_003298ec:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 0x16;
    break;
  case 0x30:
    pcVar6 = L"standardbutton-yes-";
    goto LAB_00329846;
  case 0x31:
    pcVar6 = L"standardbutton-no-";
LAB_00329345:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 0x12;
    break;
  case 0x32:
    pcVar6 = L"arrow-up-";
LAB_003297e8:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 9;
    break;
  case 0x33:
    pcVar6 = L"arrow-down-";
    goto LAB_00329925;
  case 0x34:
    pcVar6 = L"arrow-left-";
    goto LAB_00329925;
  case 0x35:
    pcVar6 = L"arrow-right-";
    goto LAB_00329957;
  case 0x36:
    pQVar3 = QStyle::proxy(pQVar3);
    bVar2 = rtl((QStyleOption *)widget);
    bVar4 = bVar2 | 0x34;
    goto LAB_0032972e;
  case 0x37:
  case 0x39:
    pQVar3 = QStyle::proxy(pQVar3);
    bVar2 = rtl((QStyleOption *)widget);
    bVar4 = bVar2 ^ 0x35;
LAB_0032972e:
    (**(code **)(*(long *)pQVar3 + 0x100))(this,pQVar3,bVar4,widget);
    goto LAB_0032997f;
  case 0x3b:
    local_48.d = (Data *)0x2000000018;
    pcVar6 = L"refresh-";
LAB_003298a8:
    sStackY_70 = 8;
    goto LAB_003298aa;
  case 0x3c:
    local_48.d = (Data *)0x2000000018;
    pcVar6 = L"stop-";
    sStackY_70 = 5;
LAB_003298aa:
    sVar7 = sStackY_70;
    puVar5 = (undefined1 *)&local_48;
    sStackY_70 = 2;
    goto LAB_00329963;
  case 0x3d:
    pcVar6 = L"media-play-";
    goto LAB_00329925;
  case 0x3e:
    pcVar6 = L"media-stop-";
LAB_00329925:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 0xb;
    break;
  case 0x3f:
    pcVar6 = L"media-pause-";
LAB_00329957:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 0xc;
    break;
  case 0x40:
    pcVar6 = L"media-skip-forward-";
    goto LAB_00329846;
  case 0x41:
    pcVar6 = L"media-skip-backward-";
    goto LAB_003298d0;
  case 0x42:
    pcVar6 = L"media-seek-forward-";
LAB_00329846:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 0x13;
    break;
  case 0x43:
    pcVar6 = L"media-seek-backward-";
LAB_003298d0:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 0x14;
    break;
  case 0x44:
    pcVar6 = L"media-volume-";
    sStackY_70 = 0xd;
    goto LAB_00329912;
  case 0x45:
    pcVar6 = L"media-volume-muted-";
    sStackY_70 = 0x13;
LAB_00329912:
    sVar7 = sStackY_70;
    local_48.d = (Data *)CONCAT44(local_48.d._4_4_,0x10);
    puVar5 = (undefined1 *)&local_48;
    sStackY_70 = 1;
    goto LAB_00329963;
  case 0x46:
    pcVar6 = L"cleartext-";
LAB_0032993e:
    puVar5 = _ZGRL12pngIconSizes_;
    sStackY_70 = 10;
    break;
  case 0x4e:
    state = Off;
    sStackY_70 = 3;
    prefix_00.m_data = L"standardbutton-closetab-";
    prefix_00.m_size = 0x18;
    sizes_00._M_len = 3;
    sizes_00._M_array = (iterator)_ZGRL12pngIconSizes_;
    addIconFiles<int>(prefix_00,sizes_00,&icon,Normal,Off);
    prefix_01.m_data = L"standardbutton-closetab-down-";
    prefix_01.m_size = 0x1d;
    sizes_01._M_len = 3;
    sizes_01._M_array = (iterator)_ZGRL12pngIconSizes_;
    addIconFiles<int>(prefix_01,sizes_01,&icon,Normal,On);
    pcVar6 = L"standardbutton-closetab-hover-";
    sVar7 = 0x1e;
    mode = Active;
    puVar5 = _ZGRL12pngIconSizes_;
    goto LAB_0032996c;
  }
  sVar7 = sStackY_70;
  sStackY_70 = 3;
LAB_00329963:
  state = Off;
LAB_00329969:
  mode = Normal;
LAB_0032996c:
  prefix_02.m_data = pcVar6;
  prefix_02.m_size = sVar7;
  sizes_02._M_len = sStackY_70;
  sizes_02._M_array = (iterator)puVar5;
  addIconFiles<int>(prefix_02,sizes_02,&icon,mode,state);
switchD_003291f7_caseD_18:
  QVar1.d = icon.d;
  icon.d = (QIconPrivate *)0x0;
  *(QIconPrivate **)&this->super_QStylePrivate = QVar1.d;
LAB_0032997f:
  QIcon::~QIcon(&icon);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QCommonStylePrivate::iconFromResourceTheme(QCommonStyle::StandardPixmap standardIcon,
                                                 const QStyleOption *option,
                                                 const QWidget *widget) const
{
    Q_Q(const QCommonStyle);
    QIcon icon;
#ifndef QT_NO_IMAGEFORMAT_PNG
    switch (standardIcon) {
    case QStyle::SP_MessageBoxInformation:
        addIconFiles(u"information-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxWarning:
        addIconFiles(u"warning-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxCritical:
        addIconFiles(u"critical-", pngIconSizes, icon);
        break;
    case QStyle::SP_MessageBoxQuestion:
        addIconFiles(u"question-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogStart:
        addIconFiles(u"filedialog_start-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogEnd:
        addIconFiles(u"filedialog_end-", pngIconSizes, icon);
        break;
    case QStyle::SP_TitleBarMinButton:
        addIconFiles(u"titlebar-min-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarMaxButton:
        addIconFiles(u"titlebar-max-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarShadeButton:
        addIconFiles(u"titlebar-shade-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarUnshadeButton:
        addIconFiles(u"titlebar-unshade-", titleBarSizes, icon);
        break;
    case QStyle::SP_TitleBarContextHelpButton:
        addIconFiles(u"titlebar-contexthelp-", titleBarSizes, icon);
        break;
     case QStyle::SP_FileDialogNewFolder:
        addIconFiles(u"newdirectory-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogBack:
        return q->proxy()->standardIcon(QStyle::SP_ArrowBack, option, widget);
    case QStyle::SP_FileDialogToParent:
        return q->proxy()->standardIcon(QStyle::SP_ArrowUp, option, widget);
    case QStyle::SP_FileDialogDetailedView:
        addIconFiles(u"viewdetailed-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogInfoView:
        addIconFiles(u"fileinfo-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogContentsView:
        addIconFiles(u"filecontents-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileDialogListView:
        addIconFiles(u"viewlist-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogOkButton:
        addIconFiles(u"standardbutton-ok-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogCancelButton:
        addIconFiles(u"standardbutton-cancel-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogHelpButton:
        addIconFiles(u"standardbutton-help-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogOpenButton:
        addIconFiles(u"standardbutton-open-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogSaveButton:
        addIconFiles(u"standardbutton-save-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogCloseButton:
        addIconFiles(u"standardbutton-close-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogApplyButton:
        addIconFiles(u"standardbutton-apply-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogResetButton:
        addIconFiles(u"standardbutton-clear-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogDiscardButton:
        addIconFiles(u"standardbutton-delete-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogYesButton:
        addIconFiles(u"standardbutton-yes-", pngIconSizes, icon);
        break;
    case QStyle::SP_DialogNoButton:
        addIconFiles(u"standardbutton-no-", pngIconSizes, icon);
        break;
    case QStyle::SP_CommandLink:
    case QStyle::SP_ArrowForward:
        return q->proxy()->standardIcon(rtl(option) ? QStyle::SP_ArrowLeft
                                                    : QStyle::SP_ArrowRight,
                                        option, widget);
    case QStyle::SP_ArrowBack:
        return q->proxy()->standardIcon(rtl(option) ? QStyle::SP_ArrowRight
                                                    : QStyle::SP_ArrowLeft,
                                        option, widget);
    case QStyle::SP_ArrowLeft:
        addIconFiles(u"arrow-left-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowRight:
        addIconFiles(u"arrow-right-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowUp:
        addIconFiles(u"arrow-up-", pngIconSizes, icon);
        break;
    case QStyle::SP_ArrowDown:
        addIconFiles(u"arrow-down-", pngIconSizes, icon);
        break;
   case QStyle::SP_DirHomeIcon:
   case QStyle::SP_DirIcon:
        addIconFiles(u"dirclosed-", pngIconSizes, icon, QIcon::Normal, QIcon::Off);
        addIconFiles(u"diropen-", pngIconSizes, icon, QIcon::Normal, QIcon::On);
        break;
    case QStyle::SP_DirOpenIcon:
        addIconFiles(u"diropen-", pngIconSizes, icon);
        break;
    case QStyle::SP_DirClosedIcon:
        addIconFiles(u"dirclosed-", pngIconSizes, icon);
        break;
    case QStyle::SP_DirLinkIcon:
        addIconFiles(u"dirlink-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveCDIcon:
        addIconFiles(u"cdr-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveFDIcon:
        addIconFiles(u"floppy-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveHDIcon:
        addIconFiles(u"harddrive-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveDVDIcon:
        addIconFiles(u"dvd-", pngIconSizes, icon);
        break;
    case QStyle::SP_DriveNetIcon:
        addIconFiles(u"networkdrive-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileIcon:
        addIconFiles(u"file-", pngIconSizes, icon);
        break;
    case QStyle::SP_FileLinkIcon:
        addIconFiles(u"filelink-", pngIconSizes, icon);
        break;
    case QStyle::SP_DesktopIcon:
        addIconFiles(u"desktop-", {16, 32}, icon);
        break;
    case QStyle::SP_TrashIcon:
        addIconFiles(u"trash-", pngIconSizes, icon);
        break;
    case QStyle::SP_ComputerIcon:
        addIconFiles(u"computer-", {16, 32}, icon);
        break;
    case QStyle::SP_BrowserReload:
        addIconFiles(u"refresh-", {24, 32}, icon);
        break;
    case QStyle::SP_BrowserStop:
        addIconFiles(u"stop-", {24, 32}, icon);
        break;
    case QStyle::SP_MediaPlay:
        addIconFiles(u"media-play-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaPause:
        addIconFiles(u"media-pause-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaStop:
        addIconFiles(u"media-stop-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSeekForward:
        addIconFiles(u"media-seek-forward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSeekBackward:
        addIconFiles(u"media-seek-backward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSkipForward:
        addIconFiles(u"media-skip-forward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaSkipBackward:
        addIconFiles(u"media-skip-backward-", pngIconSizes, icon);
        break;
    case QStyle::SP_MediaVolume:
        addIconFiles(u"media-volume-", {16}, icon);
        break;
    case QStyle::SP_MediaVolumeMuted:
        addIconFiles(u"media-volume-muted-", {16}, icon);
        break;
    case QStyle::SP_TitleBarCloseButton:
    case QStyle::SP_DockWidgetCloseButton:
        addIconFiles(u"closedock-", dockTitleIconSizes, icon);
        break;
    case QStyle::SP_TitleBarMenuButton:
#  ifndef QT_NO_IMAGEFORMAT_XPM
        icon.addPixmap(titleBarMenuCachedPixmapFromXPM());
#  endif
        icon.addFile(":/qt-project.org/qmessagebox/images/qtlogo-64.png"_L1);
        break;
    case QStyle::SP_TitleBarNormalButton:
        addIconFiles(u"normalizedockup-", dockTitleIconSizes, icon);
        break;
    case QStyle::SP_ToolBarHorizontalExtensionButton:
        addIconFiles(rtl(option) ? u"toolbar-ext-h-rtl-"_sv : u"toolbar-ext-h-"_sv, toolBarExtHSizes, icon);
        break;
    case QStyle::SP_ToolBarVerticalExtensionButton:
        addIconFiles(u"toolbar-ext-v-", toolBarExtVSizes, icon);
        break;
    case QStyle::SP_TabCloseButton:
        addIconFiles(u"standardbutton-closetab-", pngIconSizes, icon, QIcon::Normal, QIcon::Off);
        addIconFiles(u"standardbutton-closetab-down-", pngIconSizes, icon, QIcon::Normal, QIcon::On);
        addIconFiles(u"standardbutton-closetab-hover-", pngIconSizes, icon, QIcon::Active, QIcon::Off);
        break;
    case QStyle::SP_LineEditClearButton:
        addIconFiles(u"cleartext-", pngIconSizes, icon);
        break;
    default:
        break;
    }
#else // QT_NO_IMAGEFORMAT_PNG
    Q_UNUSED(standardIcon);
    Q_UNUSED(option);
    Q_UNUSED(widget);
#endif // QT_NO_IMAGEFORMAT_PNG
    return icon;
}